

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

roaring64_iterator_t * roaring64_iterator_create_last(roaring64_bitmap_t *r)

{
  roaring64_iterator_t *prVar1;
  
  prVar1 = (roaring64_iterator_t *)roaring_malloc(0xb0);
  prVar1 = roaring64_iterator_init_at(r,prVar1,false);
  return prVar1;
}

Assistant:

roaring64_iterator_t *roaring64_iterator_create_last(
    const roaring64_bitmap_t *r) {
    roaring64_iterator_t *it =
        (roaring64_iterator_t *)roaring_malloc(sizeof(roaring64_iterator_t));
    return roaring64_iterator_init_at(r, it, /*first=*/false);
}